

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O1

ion_err_t bpptree_close_dictionary(ion_dictionary_t *dictionary)

{
  ion_dictionary_parent_t *piVar1;
  ion_bpp_err_t iVar2;
  
  piVar1 = dictionary->instance;
  iVar2 = b_close(*(ion_bpp_handle_t *)(piVar1 + 1));
  ion_fclose(*(ion_file_handle_t *)&piVar1[1].record.value_size);
  free(dictionary->instance);
  dictionary->instance = (ion_dictionary_parent_t *)0x0;
  return (iVar2 != bErrOk) << 2;
}

Assistant:

ion_err_t
bpptree_close_dictionary(
	ion_dictionary_t *dictionary
) {
	ion_bpptree_t	*bpptree;
	ion_bpp_err_t	bErr;

	bpptree					= (ion_bpptree_t *) dictionary->instance;
	bErr					= b_close(bpptree->tree);
	ion_fclose(bpptree->values.file_handle);
	free(dictionary->instance);
	dictionary->instance	= NULL;

	if (bErrOk != bErr) {
		return err_dictionary_destruction_error;
	}

	return err_ok;
}